

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

bool tinyusdz::WriteMaterialXToString(MtlxModel *mtlx,string *xml_str,string *warn,string *err)

{
  MtlxUsdPreviewSurface *shader;
  MtlxAutodeskStandardSurface *pMVar1;
  ostream *poVar2;
  string local_370 [32];
  ostringstream local_350 [8];
  ostringstream ss_e_1;
  string local_1d8 [32];
  ostringstream local_1b8 [8];
  ostringstream ss_e;
  MtlxAutodeskStandardSurface *adskss;
  MtlxUsdPreviewSurface *usdps;
  string *err_local;
  string *warn_local;
  string *xml_str_local;
  MtlxModel *mtlx_local;
  
  shader = value::Value::as<tinyusdz::MtlxUsdPreviewSurface>(&mtlx->shader,false);
  if (shader == (MtlxUsdPreviewSurface *)0x0) {
    pMVar1 = value::Value::as<tinyusdz::MtlxAutodeskStandardSurface>(&mtlx->shader,false);
    if (pMVar1 == (MtlxAutodeskStandardSurface *)0x0) {
      ::std::__cxx11::ostringstream::ostringstream(local_350);
      poVar2 = ::std::operator<<((ostream *)local_350,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"WriteMaterialXToString");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3a3);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_350,"Unknown/unsupported shader: ");
      poVar2 = ::std::operator<<(poVar2,(string *)&mtlx->shader_name);
      ::std::operator<<(poVar2,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_370);
        ::std::__cxx11::string::~string(local_370);
      }
      mtlx_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_350);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1b8);
      poVar2 = ::std::operator<<((ostream *)local_1b8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"WriteMaterialXToString");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3a0);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1b8,"TODO: AutodeskStandardSurface");
      ::std::operator<<(poVar2,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_1d8);
        ::std::__cxx11::string::~string(local_1d8);
      }
      mtlx_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_1b8);
    }
  }
  else {
    mtlx_local._7_1_ = detail::WriteMaterialXToString(shader,xml_str,warn,err);
  }
  return mtlx_local._7_1_;
}

Assistant:

bool WriteMaterialXToString(const MtlxModel &mtlx, std::string &xml_str,
                            std::string *warn, std::string *err) {
  if (auto usdps = mtlx.shader.as<MtlxUsdPreviewSurface>()) {
    return detail::WriteMaterialXToString(*usdps, xml_str, warn, err);
  } else if (auto adskss = mtlx.shader.as<MtlxAutodeskStandardSurface>()) {
    (void)adskss;
    // TODO
    PUSH_ERROR_AND_RETURN("TODO: AutodeskStandardSurface");
  } else {
    // TODO
    PUSH_ERROR_AND_RETURN("Unknown/unsupported shader: " << mtlx.shader_name);
  }

  return false;
}